

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O0

image * __thiscall basisu::image::flip_y(image *this)

{
  color_rgba *__a;
  color_rgba *__b;
  image *in_RDI;
  uint32_t x;
  uint32_t y;
  uint uVar1;
  uint uVar2;
  
  for (uVar2 = 0; uVar2 < in_RDI->m_height >> 1; uVar2 = uVar2 + 1) {
    for (uVar1 = 0; uVar1 < in_RDI->m_width; uVar1 = uVar1 + 1) {
      __a = operator()((image *)CONCAT44(uVar2,uVar1),(uint32_t)((ulong)in_RDI >> 0x20),
                       (uint32_t)in_RDI);
      __b = operator()((image *)CONCAT44(uVar2,uVar1),(uint32_t)((ulong)in_RDI >> 0x20),
                       (uint32_t)in_RDI);
      std::swap<basisu::color_rgba>(__a,__b);
    }
  }
  return in_RDI;
}

Assistant:

image &flip_y()
		{
			for (uint32_t y = 0; y < m_height / 2; ++y)
				for (uint32_t x = 0; x < m_width; ++x)
					std::swap((*this)(x, y), (*this)(x, m_height - 1 - y));
			return *this;
		}